

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

MDNode * LLVMBC::dyn_cast<LLVMBC::MDNode>(MDOperand *md)

{
  MetadataKind MVar1;
  MDNode *pMVar2;
  
  if (md != (MDOperand *)0x0) {
    MVar1 = MDOperand::get_metadata_kind(md);
    pMVar2 = (MDNode *)0x0;
    if (MVar1 == Node) {
      pMVar2 = (MDNode *)md;
    }
    return pMVar2;
  }
  return (MDNode *)0x0;
}

Assistant:

inline T *dyn_cast(MDOperand *md)
{
	if (!md)
		return nullptr;

	if (md->get_metadata_kind() == T::get_metadata_kind())
		return static_cast<T *>(md);
	else
		return nullptr;
}